

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskContainer.cpp
# Opt level: O1

int __thiscall DataContainer::GetTypeFromFile(DataContainer *this,ITypeManager *manager)

{
  pointer pcVar1;
  int iVar2;
  int iVar3;
  FILE *__stream;
  ulong __size;
  void *__ptr;
  long *local_50 [2];
  long local_40 [2];
  
  iVar2 = GetTypeFromZippedFile(this,manager);
  iVar3 = -1;
  if (iVar2 == 0) {
    __stream = fopen((this->current_path_)._M_dataplus._M_p,"rb");
    if (__stream == (FILE *)0x0) {
      iVar3 = 0;
    }
    else {
      fseek(__stream,0,2);
      __size = ftell(__stream);
      rewind(__stream);
      __ptr = operator_new__(__size);
      fread(__ptr,__size,1,__stream);
      fclose(__stream);
      iVar3 = (*manager->_vptr_ITypeManager[1])(manager,__ptr,__size & 0xffffffff);
      if (iVar3 == 0) {
        pcVar1 = (this->current_path_)._M_dataplus._M_p;
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_50,pcVar1,pcVar1 + (this->current_path_)._M_string_length);
        iVar3 = (**manager->_vptr_ITypeManager)(manager,(string *)local_50);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
      }
      operator_delete__(__ptr);
    }
  }
  return iVar3;
}

Assistant:

int DataContainer::GetTypeFromFile(ITypeManager* manager)
{
   FILE* f;
   int ret = GetTypeFromZippedFile(manager);
   if (ret != 0)
   {
      return ret;
   }
   if (fopen_s(&f, current_path_.c_str(), "rb") == 0)
   {
      fseek(f, 0, SEEK_END);
      const long size = ftell(f);
      rewind(f);

      auto* header = new unsigned char[size];

      fread(header, size, 1, f);
      fclose(f);

      // Anything from the buffer ?
      ret = manager->GetTypeFromBuffer(header, size);

      // No, check with name
      if (ret == 0)
      {
         ret = manager->GetTypeFromFile(current_path_);
      }

      delete []header;
   }
   return ret;
}